

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::LinkedModelFile::Clear(LinkedModelFile *this)

{
  if (this->linkedmodelfilename_ != (StringParameter *)0x0) {
    (*(this->linkedmodelfilename_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->linkedmodelfilename_ = (StringParameter *)0x0;
  if (this->linkedmodelsearchpath_ != (StringParameter *)0x0) {
    (*(this->linkedmodelsearchpath_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->linkedmodelsearchpath_ = (StringParameter *)0x0;
  return;
}

Assistant:

void LinkedModelFile::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LinkedModelFile)
  if (GetArenaNoVirtual() == NULL && linkedmodelfilename_ != NULL) {
    delete linkedmodelfilename_;
  }
  linkedmodelfilename_ = NULL;
  if (GetArenaNoVirtual() == NULL && linkedmodelsearchpath_ != NULL) {
    delete linkedmodelsearchpath_;
  }
  linkedmodelsearchpath_ = NULL;
}